

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  int iVar1;
  TTD_PTR_ID *pTVar2;
  TTD_PTR_ID TVar3;
  
  pTVar2 = (TTD_PTR_ID *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  TVar3 = FileReader::ReadAddr(reader,ptrIdVal,true);
  *pTVar2 = TVar3;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  *(byte *)(pTVar2 + 1) = (byte)iVar1;
  TVar3 = FileReader::ReadAddr(reader,ptrIdVal,true);
  pTVar2[2] = TVar3;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  *(byte *)(pTVar2 + 3) = (byte)iVar1;
  if (snpObject->SnapObjectTag == SnapPromiseResolveOrRejectFunctionObject) {
    snpObject->AddtlSnapObjectInfo = pTVar2;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseResolveOrRejectFunctionInfo* rrfInfo = alloc.SlabAllocateStruct<SnapPromiseResolveOrRejectFunctionInfo>();

            rrfInfo->PromiseId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            rrfInfo->IsReject = reader->ReadBool(NSTokens::Key::boolVal, true);

            rrfInfo->AlreadyResolvedWrapperId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            rrfInfo->AlreadyResolvedValue = reader->ReadBool(NSTokens::Key::boolVal, true);

            SnapObjectSetAddtlInfoAs<SnapPromiseResolveOrRejectFunctionInfo*, SnapObjectType::SnapPromiseResolveOrRejectFunctionObject>(snpObject, rrfInfo);
        }